

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * lest::to_string<double>(string *__return_storage_ptr__,double *value)

{
  double *in_RDX;
  string local_30;
  
  string_maker<double>::to_string_abi_cxx11_(&local_30,(string_maker<double> *)value,in_RDX);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_30);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( T const & value )
{
    return string_maker<T>::to_string( value );
}